

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

void __thiscall Assembler::writeAll(Assembler *this)

{
  char *pcVar1;
  pointer pvVar2;
  int iVar3;
  type_info *ptVar4;
  ostream *poVar5;
  long *plVar6;
  int *piVar7;
  ulong uVar8;
  pointer pIVar9;
  string *psVar10;
  Assembler *pAVar11;
  pointer paVar12;
  long lVar13;
  ulong uVar14;
  pointer pIVar15;
  string function_name;
  char local_79;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  pointer local_58;
  Instruction *local_50;
  pointer local_48;
  Instruction local_40;
  
  poVar5 = this->_wtr;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".constants:",0xb);
  local_78[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_78,1);
  paVar12 = (this->_consts).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_consts).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar12) {
    lVar13 = 0;
    uVar14 = 0;
    do {
      ptVar4 = std::any::type((any *)((long)&paVar12->_M_manager + lVar13));
      pcVar1 = *(char **)(ptVar4 + 8);
      if (pcVar1 == _put) {
LAB_0011961a:
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)this->_wtr,(int)uVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tI\t",3);
        piVar7 = (int *)std::__any_caster<int>
                                  ((any *)((long)&((this->_consts).
                                                                                                      
                                                  super__Vector_base<std::any,_std::allocator<std::any>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_manager + lVar13));
        if (piVar7 == (int *)0x0) goto LAB_00119a6b;
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,*piVar7);
        local_78[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_78,1);
      }
      else {
        if (*pcVar1 != '*') {
          iVar3 = strcmp(pcVar1,_put);
          if (iVar3 == 0) goto LAB_0011961a;
        }
        ptVar4 = std::any::type((any *)((long)&((this->_consts).
                                                super__Vector_base<std::any,_std::allocator<std::any>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_manager + lVar13));
        pcVar1 = *(char **)(ptVar4 + 8);
        if (pcVar1 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
          if (*pcVar1 == '*') {
LAB_00119a70:
            psVar10 = (string *)__cxa_allocate_exception(0x28);
            local_50 = &local_40;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Unvalid typeid","")
            ;
            *(string **)psVar10 = psVar10 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      (psVar10,local_50,(long)&local_50->_opr + (long)&local_48->_opr);
            *(undefined8 *)(psVar10 + 0x20) = 0;
            __cxa_throw(psVar10,&Error::typeinfo,Error::~Error);
          }
          iVar3 = strcmp(pcVar1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
          if (iVar3 != 0) goto LAB_00119a70;
        }
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)this->_wtr,(int)uVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tS\t\"",4);
        plVar6 = (long *)std::__any_caster<std::__cxx11::string>
                                   ((any *)((long)&((this->_consts).
                                                                                                        
                                                  super__Vector_base<std::any,_std::allocator<std::any>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_manager + lVar13));
        if (plVar6 == (long *)0x0) goto LAB_00119a6b;
        local_78._0_8_ = local_78 + 0x10;
        std::__cxx11::string::_M_construct<char*>((string *)local_78,*plVar6,plVar6[1] + *plVar6);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_78._0_8_,local_78._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
        if ((ostream *)local_78._0_8_ != (ostream *)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
        }
      }
      uVar14 = uVar14 + 1;
      paVar12 = (this->_consts).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x10;
    } while (uVar14 < (ulong)((long)(this->_consts).
                                    super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)paVar12 >> 4));
  }
  poVar5 = this->_wtr;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".start:",7);
  local_78[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_78,1);
  if ((this->_startInstructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->_startInstructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar13 = 0;
    uVar14 = 0;
    do {
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)this->_wtr,(int)uVar14);
      local_78[0] = 9;
      pAVar11 = (Assembler *)local_78;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_78,1);
      instructionToAssembly_abi_cxx11_
                ((string *)local_78,pAVar11,
                 (Instruction *)
                 ((long)&((this->_startInstructions).
                          super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                          super__Vector_impl_data._M_start)->_opr + lVar13));
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_78._0_8_,local_78._8_8_);
      local_79 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_79,1);
      if ((ostream *)local_78._0_8_ != (ostream *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x10;
    } while (uVar14 < (ulong)((long)(this->_startInstructions).
                                    super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->_startInstructions).
                                    super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 4));
  }
  poVar5 = this->_wtr;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".functions:",0xb);
  local_78[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_78,1);
  if ((this->_instructions).
      super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_instructions).
      super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar14 = 0;
    do {
      plVar6 = (long *)std::__any_caster<std::__cxx11::string>
                                 ((this->_consts).
                                  super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                                  super__Vector_impl_data._M_start +
                                  (this->_functionNameConstant).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar14]);
      if (plVar6 == (long *)0x0) goto LAB_00119a6b;
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char*>((string *)local_78,*plVar6,plVar6[1] + *plVar6);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)this->_wtr,(int)uVar14);
      local_79 = '\t';
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_79,1);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar5,
                          (this->_functionNameConstant).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar14]);
      local_79 = '\t';
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_79,1);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
      ::operator[](&this->_functionParameter,(key_type *)local_78);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t1\n",3);
      if ((ostream *)local_78._0_8_ != (ostream *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
      }
      uVar14 = uVar14 + 1;
      uVar8 = ((long)(this->_instructions).
                     super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_instructions).
                     super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar14 <= uVar8 && uVar8 - uVar14 != 0);
  }
  if ((this->_instructions).
      super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_instructions).
      super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pIVar15 = (pointer)0x0;
    do {
      poVar5 = this->_wtr;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,".F",2);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(int)pIVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\t#",3);
      plVar6 = (long *)std::__any_caster<std::__cxx11::string>
                                 ((this->_consts).
                                  super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                                  super__Vector_impl_data._M_start +
                                  (this->_functionNameConstant).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[(long)pIVar15]);
      if (plVar6 == (long *)0x0) {
LAB_00119a6b:
        std::__throw_bad_any_cast();
      }
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char*>((string *)local_78,*plVar6,plVar6[1] + *plVar6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_78._0_8_,local_78._8_8_);
      local_79 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_79,1);
      if ((ostream *)local_78._0_8_ != (ostream *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
      }
      pvVar2 = (this->_instructions).
               super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_58 = pIVar15;
      if (*(pointer *)
           ((long)&pvVar2[(long)pIVar15].
                   super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                   super__Vector_impl_data + 8) !=
          pvVar2[(long)pIVar15].super__Vector_base<Instruction,_std::allocator<Instruction>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        lVar13 = 0;
        uVar14 = 0;
        do {
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)this->_wtr,(int)uVar14);
          local_78[0] = 9;
          pAVar11 = (Assembler *)local_78;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_78,1);
          instructionToAssembly_abi_cxx11_
                    ((string *)local_78,pAVar11,
                     (Instruction *)
                     (*(long *)&(this->_instructions).
                                super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(long)pIVar15].
                                super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                                _M_impl.super__Vector_impl_data + lVar13));
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(char *)local_78._0_8_,local_78._8_8_);
          local_79 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_79,1);
          if ((ostream *)local_78._0_8_ != (ostream *)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
          }
          pvVar2 = (this->_instructions).
                   super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar14 = uVar14 + 1;
          lVar13 = lVar13 + 0x10;
        } while (uVar14 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar2[(long)pIVar15].
                                                 super__Vector_base<Instruction,_std::allocator<Instruction>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  *(long *)&pvVar2[(long)pIVar15].
                                            super__Vector_base<Instruction,_std::allocator<Instruction>_>
                                            ._M_impl.super__Vector_impl_data >> 4));
      }
      pIVar15 = (pointer)((long)&local_58->_opr + 1);
      pIVar9 = (pointer)(((long)(this->_instructions).
                                super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->_instructions).
                                super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x5555555555555555);
    } while (pIVar15 <= pIVar9 && (long)pIVar9 - (long)pIVar15 != 0);
  }
  return;
}

Assistant:

void Assembler::writeAll() {
	//const
	_wtr << ".constants:" << '\n';
	for (int i = 0; i < _consts.size(); i++) {
		if (_consts[i].type() == typeid(int)) {
			_wtr << i << "\tI\t" << std::any_cast<int>(_consts[i]) << '\n';
		}
		else if (_consts[i].type() == typeid(std::string)) {
			_wtr << i << "\tS\t\"" << std::any_cast<std::string>(_consts[i]) << "\"\n";
		}
		else {
			throw Error("Unvalid typeid");
		}
	}
	//start code
	_wtr << ".start:" << '\n';
	for (int i = 0; i < _startInstructions.size(); i++) {
		_wtr << i << '\t' << instructionToAssembly(_startInstructions[i]) << '\n';
	}
	//function table
	_wtr << ".functions:" << '\n';
	for (int i = 0; i < _instructions.size(); i++) {
		std::string function_name = std::any_cast<std::string>(_consts[_functionNameConstant[i]]);
		_wtr << i << '\t' << _functionNameConstant[i] << '\t' << _functionParameter[function_name].size() << "\t1\n";
	}
	//function instructions table
	for (int i = 0; i < _instructions.size(); i++) {
		_wtr << ".F" << i << ":\t#" << std::any_cast<std::string>(_consts[_functionNameConstant[i]]) << '\n';
		for (int j = 0; j < _instructions[i].size(); j++) {
			_wtr << j << '\t' << instructionToAssembly(_instructions[i][j]) << '\n';
		}
	}
}